

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

char * __thiscall MeCab::ChunkFreeList<char>::alloc(ChunkFreeList<char> *this,size_t req)

{
  char *pcVar1;
  long lVar2;
  size_type sVar3;
  reference pvVar4;
  unsigned_long *puVar5;
  vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  *this_00;
  ulong uVar6;
  unsigned_long in_RSI;
  long in_RDI;
  size_t _size;
  char *r;
  value_type *in_stack_ffffffffffffff98;
  unsigned_long local_18 [3];
  
  local_18[0] = in_RSI;
  while( true ) {
    uVar6 = *(ulong *)(in_RDI + 0x28);
    sVar3 = std::
            vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ::size((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                    *)(in_RDI + 8));
    if (sVar3 <= uVar6) {
      puVar5 = std::max<unsigned_long>(local_18,(unsigned_long *)(in_RDI + 0x30));
      this_00 = (vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                 *)(in_RDI + 8);
      operator_new__(*puVar5);
      std::make_pair<unsigned_long&,char*>
                ((unsigned_long *)this_00,(char **)in_stack_ffffffffffffff98);
      std::
      vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>::
      push_back(this_00,in_stack_ffffffffffffff98);
      sVar3 = std::
              vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
              ::size((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                      *)(in_RDI + 8));
      *(size_type *)(in_RDI + 0x28) = sVar3 - 1;
      *(unsigned_long *)(in_RDI + 0x20) = local_18[0] + *(long *)(in_RDI + 0x20);
      pvVar4 = std::
               vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                             *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
      return pvVar4->second;
    }
    uVar6 = *(long *)(in_RDI + 0x20) + local_18[0];
    pvVar4 = std::
             vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                           *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
    if (uVar6 < pvVar4->first) break;
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  pvVar4 = std::
           vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
           ::operator[]((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                         *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
  pcVar1 = pvVar4->second;
  lVar2 = *(long *)(in_RDI + 0x20);
  *(unsigned_long *)(in_RDI + 0x20) = local_18[0] + *(long *)(in_RDI + 0x20);
  return pcVar1 + lVar2;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }